

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.h
# Opt level: O1

void __thiscall
llbuild::buildsystem::ShellCommand::getVerboseDescription
          (ShellCommand *this,SmallVectorImpl<char> *result)

{
  pointer pSVar1;
  bool bVar2;
  size_t in_RCX;
  StringRef *arg;
  pointer pSVar3;
  StringRef Str;
  StringRef string;
  raw_svector_ostream os;
  raw_ostream local_50;
  SmallVectorImpl<char> *local_28;
  
  local_50.BufferMode = InternalBuffer;
  local_50.OutBufStart = (char *)0x0;
  local_50.OutBufEnd = (char *)0x0;
  local_50.OutBufCur = (char *)0x0;
  local_50._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_00258b50;
  local_28 = result;
  llvm::raw_ostream::SetUnbuffered(&local_50);
  pSVar3 = (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pSVar3 != pSVar1) {
    bVar2 = true;
    do {
      if (!bVar2) {
        Str.Length = 1;
        Str.Data = " ";
        llvm::raw_ostream::operator<<(&local_50,Str);
      }
      string.Length = in_RCX;
      string.Data = (char *)pSVar3->Length;
      basic::appendShellEscapedString((basic *)&local_50,(raw_ostream *)pSVar3->Data,string);
      pSVar3 = pSVar3 + 1;
      bVar2 = false;
    } while (pSVar3 != pSVar1);
  }
  llvm::raw_ostream::~raw_ostream(&local_50);
  return;
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream os(result);
    bool first = true;
    for (const auto& arg: args) {
      if (!first) os << " ";
      first = false;
      basic::appendShellEscapedString(os, arg);
    }
  }